

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_avx2.c
# Opt level: O2

void variance_kernel_avx2(__m256i src,__m256i ref,__m256i *sse,__m256i *sum)

{
  __m256i alVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar5 [32];
  undefined1 in_ZMM1 [64];
  
  auVar4 = vpunpcklbw_avx2(in_ZMM0._0_32_,in_ZMM1._0_32_);
  auVar3 = vpunpckhbw_avx2(in_ZMM0._0_32_,in_ZMM1._0_32_);
  auVar5._8_2_ = 0xff01;
  auVar5._0_8_ = 0xff01ff01ff01ff01;
  auVar5._10_2_ = 0xff01;
  auVar5._12_2_ = 0xff01;
  auVar5._14_2_ = 0xff01;
  auVar5._16_2_ = 0xff01;
  auVar5._18_2_ = 0xff01;
  auVar5._20_2_ = 0xff01;
  auVar5._22_2_ = 0xff01;
  auVar5._24_2_ = 0xff01;
  auVar5._26_2_ = 0xff01;
  auVar5._28_2_ = 0xff01;
  auVar5._30_2_ = 0xff01;
  auVar4 = vpmaddubsw_avx2(auVar4,auVar5);
  auVar5 = vpmaddubsw_avx2(auVar3,auVar5);
  auVar3 = vpmaddwd_avx2(auVar4,auVar4);
  auVar2 = vpmaddwd_avx2(auVar5,auVar5);
  auVar3 = vpaddd_avx2(auVar2,auVar3);
  auVar4 = vpaddw_avx2(auVar5,auVar4);
  alVar1 = (__m256i)vpaddw_avx2(auVar4,(undefined1  [32])*sum);
  *sum = alVar1;
  alVar1 = (__m256i)vpaddd_avx2(auVar3,(undefined1  [32])*sse);
  *sse = alVar1;
  return;
}

Assistant:

static inline void variance_kernel_avx2(const __m256i src, const __m256i ref,
                                        __m256i *const sse,
                                        __m256i *const sum) {
  const __m256i adj_sub = _mm256_set1_epi16((short)0xff01);  // (1,-1)

  // unpack into pairs of source and reference values
  const __m256i src_ref0 = _mm256_unpacklo_epi8(src, ref);
  const __m256i src_ref1 = _mm256_unpackhi_epi8(src, ref);

  // subtract adjacent elements using src*1 + ref*-1
  const __m256i diff0 = _mm256_maddubs_epi16(src_ref0, adj_sub);
  const __m256i diff1 = _mm256_maddubs_epi16(src_ref1, adj_sub);
  const __m256i madd0 = _mm256_madd_epi16(diff0, diff0);
  const __m256i madd1 = _mm256_madd_epi16(diff1, diff1);

  // add to the running totals
  *sum = _mm256_add_epi16(*sum, _mm256_add_epi16(diff0, diff1));
  *sse = _mm256_add_epi32(*sse, _mm256_add_epi32(madd0, madd1));
}